

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_element_generic(lysp_yin_ctx *ctx,ly_stmt parent_stmt,lysp_stmt **element)

{
  ly_ctx *plVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  ly_stmt lVar5;
  LY_ERR LVar6;
  lysp_stmt *plVar7;
  size_t sVar8;
  char *pcVar9;
  char *local_a8;
  char *local_98;
  ly_ctx *local_70;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *id;
  lysp_stmt *new;
  lysp_stmt *last;
  lysp_stmt **pplStack_28;
  LY_ERR ret;
  lysp_stmt **element_local;
  lysp_yin_ctx *plStack_18;
  ly_stmt parent_stmt_local;
  lysp_yin_ctx *ctx_local;
  
  last._4_4_ = 0;
  new = (lysp_stmt *)0x0;
  id = (char *)0x0;
  pplStack_28 = element;
  element_local._4_4_ = parent_stmt;
  plStack_18 = ctx;
  if (ctx->xmlctx->status != LYXML_ELEMENT) {
    __assert_fail("ctx->xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0xc9e,
                  "LY_ERR yin_parse_element_generic(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_stmt **)"
                 );
  }
  plVar7 = (lysp_stmt *)calloc(1,0x38);
  *pplStack_28 = plVar7;
  if (*pplStack_28 == (lysp_stmt *)0x0) {
    ly_log(plStack_18->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "yin_parse_element_generic");
    return LY_EMEM;
  }
  if ((plStack_18->xmlctx->field_4).prefix_len == 0) {
    last._4_4_ = lydict_insert(plStack_18->xmlctx->ctx,(plStack_18->xmlctx->field_5).name,
                               (plStack_18->xmlctx->field_6).name_len,&(*pplStack_28)->stmt);
  }
  else {
    iVar4 = asprintf((char **)&ret___1,"%.*s:%.*s",
                     (plStack_18->xmlctx->field_4).prefix_len & 0xffffffff,
                     (plStack_18->xmlctx->field_3).prefix,
                     (plStack_18->xmlctx->field_6).name_len & 0xffffffff,
                     (plStack_18->xmlctx->field_5).name);
    if (iVar4 == -1) {
      ly_log(plStack_18->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_element_generic");
      return LY_EMEM;
    }
    last._4_4_ = lydict_insert_zc(plStack_18->xmlctx->ctx,_ret___1,&(*pplStack_28)->stmt);
    if (last._4_4_ != LY_SUCCESS) {
      return last._4_4_;
    }
    plVar1 = plStack_18->xmlctx->ctx;
    pcVar2 = (*pplStack_28)->stmt;
    sVar8 = strlen((*pplStack_28)->stmt);
    last._4_4_ = ly_store_prefix_data
                           (plVar1,pcVar2,sVar8,LY_VALUE_XML,&plStack_18->xmlctx->ns,
                            &(*pplStack_28)->format,&(*pplStack_28)->prefix_data);
  }
  if (last._4_4_ == LY_SUCCESS) {
    last._4_4_ = 0;
    lVar5 = yin_match_keyword(plStack_18,(plStack_18->xmlctx->field_5).name,
                              (plStack_18->xmlctx->field_6).name_len,
                              (plStack_18->xmlctx->field_3).prefix,
                              (plStack_18->xmlctx->field_4).prefix_len,element_local._4_4_);
    (*pplStack_28)->kw = lVar5;
    new = (*pplStack_28)->child;
    if ((*pplStack_28)->kw == LY_STMT_NONE) {
      if (plStack_18 == (lysp_yin_ctx *)0x0) {
        local_70 = (ly_ctx *)0x0;
      }
      else {
        local_70 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      uVar3 = (plStack_18->xmlctx->field_6).name_len;
      pcVar2 = (plStack_18->xmlctx->field_5).name;
      pcVar9 = lyplg_ext_stmt2str(element_local._4_4_);
      ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YIN,
              "Unexpected sub-element \"%.*s\" of \"%s\" element.",uVar3 & 0xffffffff,pcVar2,pcVar9)
      ;
      last._4_4_ = LY_EVALID;
    }
    else if ((*pplStack_28)->kw == LY_STMT_EXTENSION_INSTANCE) {
      last._4_4_ = lyxml_ctx_next(plStack_18->xmlctx);
      while (last._4_4_ == LY_SUCCESS) {
        last._4_4_ = 0;
        if (plStack_18->xmlctx->status != LYXML_ATTRIBUTE) goto LAB_001d8e68;
        id = (char *)calloc(1,0x38);
        if ((lysp_stmt *)id == (lysp_stmt *)0x0) {
          ly_log(plStack_18->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "yin_parse_element_generic");
          return LY_EMEM;
        }
        if ((*pplStack_28)->child == (lysp_stmt *)0x0) {
          (*pplStack_28)->child = (lysp_stmt *)id;
        }
        else {
          new->next = (lysp_stmt *)id;
        }
        ((lysp_stmt *)id)->flags = ((lysp_stmt *)id)->flags | 0x400;
        new = (lysp_stmt *)id;
        last._4_4_ = lydict_insert(plStack_18->xmlctx->ctx,(plStack_18->xmlctx->field_5).name,
                                   (plStack_18->xmlctx->field_6).name_len,(char **)id);
        if (last._4_4_ != LY_SUCCESS) {
          return last._4_4_;
        }
        new->kw = LY_STMT_NONE;
        if ((plStack_18->xmlctx->field_3).prefix == (char *)0x0) {
          last._4_4_ = lyxml_ctx_next(plStack_18->xmlctx);
          if (last._4_4_ != LY_SUCCESS) {
            return last._4_4_;
          }
          if ((plStack_18->xmlctx->field_6).dynamic == '\0') {
            if ((plStack_18->xmlctx->field_4).prefix_len == 0) {
              local_98 = "";
            }
            else {
              local_98 = (plStack_18->xmlctx->field_3).prefix;
            }
            LVar6 = lydict_insert(plStack_18->xmlctx->ctx,local_98,
                                  (plStack_18->xmlctx->field_4).prefix_len,&new->arg);
          }
          else {
            LVar6 = lydict_insert_zc(plStack_18->xmlctx->ctx,(plStack_18->xmlctx->field_3).prefix,
                                     &new->arg);
          }
          if (LVar6 != LY_SUCCESS) {
            return LVar6;
          }
          (plStack_18->xmlctx->field_6).dynamic = '\0';
          if (new->arg == (char *)0x0) {
            return LY_EMEM;
          }
        }
        else {
          LVar6 = lyxml_ctx_next(plStack_18->xmlctx);
          if (LVar6 != LY_SUCCESS) {
            return LVar6;
          }
          last._4_4_ = LY_SUCCESS;
        }
        last._4_4_ = lyxml_ctx_next(plStack_18->xmlctx);
      }
    }
    else {
      last._4_4_ = yin_parse_extension_instance_arg
                             (plStack_18,(*pplStack_28)->kw,&(*pplStack_28)->arg);
      if (last._4_4_ == LY_SUCCESS) {
LAB_001d8e68:
        last._4_4_ = 0;
        if ((plStack_18->xmlctx->status == LYXML_ELEM_CONTENT) &&
           ((plStack_18->xmlctx->field_5).ws_only == '\0')) {
          if ((plStack_18->xmlctx->field_4).prefix_len != 0) {
            if ((plStack_18->xmlctx->field_6).dynamic == '\0') {
              if ((plStack_18->xmlctx->field_4).prefix_len == 0) {
                local_a8 = "";
              }
              else {
                local_a8 = (plStack_18->xmlctx->field_3).prefix;
              }
              LVar6 = lydict_insert(plStack_18->xmlctx->ctx,local_a8,
                                    (plStack_18->xmlctx->field_4).prefix_len,&(*pplStack_28)->arg);
            }
            else {
              LVar6 = lydict_insert_zc(plStack_18->xmlctx->ctx,(plStack_18->xmlctx->field_3).prefix,
                                       &(*pplStack_28)->arg);
            }
            if (LVar6 != LY_SUCCESS) {
              return LVar6;
            }
            (plStack_18->xmlctx->field_6).dynamic = '\0';
            if ((*pplStack_28)->arg == (char *)0x0) {
              return LY_EMEM;
            }
            plVar1 = plStack_18->xmlctx->ctx;
            pcVar2 = (*pplStack_28)->arg;
            sVar8 = strlen((*pplStack_28)->arg);
            LVar6 = ly_store_prefix_data
                              (plVar1,pcVar2,sVar8,LY_VALUE_XML,&plStack_18->xmlctx->ns,
                               &(*pplStack_28)->format,&(*pplStack_28)->prefix_data);
            if (LVar6 != LY_SUCCESS) {
              return LVar6;
            }
          }
          last._4_4_ = 0;
          last._4_4_ = lyxml_ctx_next(plStack_18->xmlctx);
        }
        else {
          last._4_4_ = lyxml_ctx_next(plStack_18->xmlctx);
          while (((last._4_4_ == LY_SUCCESS && (plStack_18->xmlctx->status == LYXML_ELEMENT)) &&
                 (last._4_4_ = yin_parse_element_generic
                                         (plStack_18,(*pplStack_28)->kw,(lysp_stmt **)&id),
                 last._4_4_ == LY_SUCCESS))) {
            if ((*pplStack_28)->child == (lysp_stmt *)0x0) {
              (*pplStack_28)->child = (lysp_stmt *)id;
            }
            else {
              new->next = (lysp_stmt *)id;
            }
            new = (lysp_stmt *)id;
            if (plStack_18->xmlctx->status != LYXML_ELEM_CLOSE) {
              __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CLOSE",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                            ,0xcf0,
                            "LY_ERR yin_parse_element_generic(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_stmt **)"
                           );
            }
            last._4_4_ = lyxml_ctx_next(plStack_18->xmlctx);
          }
        }
      }
    }
  }
  return last._4_4_;
}

Assistant:

LY_ERR
yin_parse_element_generic(struct lysp_yin_ctx *ctx, enum ly_stmt parent_stmt, struct lysp_stmt **element)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_stmt *last = NULL, *new = NULL;
    char *id;

    assert(ctx->xmlctx->status == LYXML_ELEMENT);

    /* allocate new structure for element */
    *element = calloc(1, sizeof(**element));
    LY_CHECK_ERR_GOTO(!(*element), LOGMEM(ctx->xmlctx->ctx); ret = LY_EMEM, cleanup);

    /* store identifier */
    if (ctx->xmlctx->prefix_len) {
        if (asprintf(&id, "%.*s:%.*s", (int)ctx->xmlctx->prefix_len, ctx->xmlctx->prefix, (int)ctx->xmlctx->name_len,
                ctx->xmlctx->name) == -1) {
            LOGMEM(ctx->xmlctx->ctx);
            ret = LY_EMEM;
            goto cleanup;
        }
        LY_CHECK_GOTO(ret = lydict_insert_zc(ctx->xmlctx->ctx, id, &(*element)->stmt), cleanup);

        /* store prefix data for the statement */
        LY_CHECK_GOTO(ret = ly_store_prefix_data(ctx->xmlctx->ctx, (*element)->stmt, strlen((*element)->stmt), LY_VALUE_XML,
                &ctx->xmlctx->ns, &(*element)->format, &(*element)->prefix_data), cleanup);
    } else {
        LY_CHECK_GOTO(ret = lydict_insert(ctx->xmlctx->ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, &(*element)->stmt), cleanup);
    }

    (*element)->kw = yin_match_keyword(ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, ctx->xmlctx->prefix,
            ctx->xmlctx->prefix_len, parent_stmt);

    last = (*element)->child;
    if ((*element)->kw == LY_STMT_NONE) {
        /* unrecognized element */
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_UNEXP_SUBELEM, (int)ctx->xmlctx->name_len, ctx->xmlctx->name,
                lyplg_ext_stmt2str(parent_stmt));
        ret = LY_EVALID;
        goto cleanup;
    } else if ((*element)->kw != LY_STMT_EXTENSION_INSTANCE) {
        /* element is known yang keyword, which means argument can be parsed correctly. */
        ret = yin_parse_extension_instance_arg(ctx, (*element)->kw, &(*element)->arg);
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

        /* load attributes in generic way, save all attributes in linked list */
        while (ctx->xmlctx->status == LYXML_ATTRIBUTE) {
            new = calloc(1, sizeof(*last));
            LY_CHECK_ERR_GOTO(!new, LOGMEM(ctx->xmlctx->ctx); ret = LY_EMEM, cleanup);
            if (!(*element)->child) {
                /* save first */
                (*element)->child = new;
            } else {
                last->next = new;
            }
            last = new;

            last->flags |= LYS_YIN_ATTR;
            LY_CHECK_GOTO(ret = lydict_insert(ctx->xmlctx->ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, &last->stmt), cleanup);
            last->kw = LY_STMT_NONE;
            /* attributes with prefix are ignored */
            if (!ctx->xmlctx->prefix) {
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

                INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, last->arg);
                LY_CHECK_ERR_GOTO(!last->arg, ret = LY_EMEM, cleanup);
            } else {
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
            }
            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    }

    if ((ctx->xmlctx->status != LYXML_ELEM_CONTENT) || ctx->xmlctx->ws_only) {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        while (ctx->xmlctx->status == LYXML_ELEMENT) {
            /* parse subelements */
            ret = yin_parse_element_generic(ctx, (*element)->kw, &new);
            LY_CHECK_GOTO(ret, cleanup);
            if (!(*element)->child) {
                /* save first */
                (*element)->child = new;
            } else {
                last->next = new;
            }
            last = new;

            assert(ctx->xmlctx->status == LYXML_ELEM_CLOSE);
            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    } else {
        /* save element content */
        if (ctx->xmlctx->value_len) {
            INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, (*element)->arg);
            LY_CHECK_ERR_GOTO(!(*element)->arg, ret = LY_EMEM, cleanup);

            /* store prefix data for the argument as well */
            LY_CHECK_GOTO(ret = ly_store_prefix_data(ctx->xmlctx->ctx, (*element)->arg, strlen((*element)->arg), LY_VALUE_XML,
                    &ctx->xmlctx->ns, &(*element)->format, &(*element)->prefix_data), cleanup);
        }

        /* read closing tag */
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    }

cleanup:
    return ret;
}